

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

word Acb_ComputeFunction(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,int fCompl)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  uint *begin;
  undefined4 in_register_00000084;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  word wVar7;
  long lVar8;
  int pLits [2];
  int local_40;
  uint local_3c;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000084,fCompl);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  begin = (uint *)malloc(400);
  p->pArray = (int *)begin;
  iVar3 = sat_solver_nvars(pSat);
  if (iVar3 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x161,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
  }
  if (((PivotVar < 0) || (1 < (uint)local_38)) ||
     (local_40 = (uint)local_38 + PivotVar * 2, FreeVar < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_3c = FreeVar * 2;
  wVar7 = 0;
  do {
    iVar3 = sat_solver_solve(pSat,&local_40,(lit *)&local_38,0,0,0,0);
    uVar1 = local_3c;
    if (iVar3 != 1) {
      if (iVar3 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x170,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
      }
      break;
    }
    local_38 = wVar7;
    if ((int)local_3c < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    if (p->nCap < 1) {
      if (begin == (uint *)0x0) {
        begin = (uint *)malloc(4);
      }
      else {
        begin = (uint *)realloc(begin,4);
      }
      p->pArray = (int *)begin;
      if (begin == (uint *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = 1;
    }
    *begin = uVar1 ^ 1;
    p->nSize = 1;
    uVar6 = 0xffffffffffffffff;
    if (vDivVars->nSize < 1) {
      iVar3 = 1;
    }
    else {
      lVar8 = 0;
      do {
        iVar3 = vDivVars->pArray[lVar8];
        if (((long)iVar3 < 0) || (pSat->size <= iVar3)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
        }
        Vec_IntPush(p,(uint)(pSat->model[iVar3] != 1) + iVar3 * 2 ^ 1);
        lVar8 = lVar8 + 1;
        uVar1 = vDivVars->nSize;
      } while (lVar8 < (int)uVar1);
      iVar3 = p->nSize;
      begin = (uint *)p->pArray;
      if (1 < (long)iVar3) {
        uVar6 = 0xffffffffffffffff;
        lVar8 = 1;
        do {
          uVar2 = begin[lVar8];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if ((int)uVar1 < 1) {
LAB_003a29e1:
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                          ,0x18d,
                          "word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
          }
          puVar5 = (uint *)vDivVars->pArray;
          lVar4 = 0;
          while (*puVar5 != uVar2 >> 1) {
            lVar4 = lVar4 + 8;
            puVar5 = puVar5 + 1;
            if ((ulong)uVar1 * 8 - lVar4 == 0) goto LAB_003a29e1;
          }
          uVar6 = uVar6 & ((ulong)(uVar2 & 1) - 1 ^ *(ulong *)((long)s_Truths6 + lVar4));
          lVar8 = lVar8 + 1;
        } while (lVar8 != iVar3);
      }
    }
    wVar7 = uVar6 | local_38;
    iVar3 = sat_solver_addclause(pSat,(lit *)begin,(lit *)(begin + iVar3));
  } while (iVar3 != 0);
  if (begin != (uint *)0x0) {
    free(begin);
  }
  free(p);
  return wVar7;
}

Assistant:

word Acb_ComputeFunction( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, int fCompl )
{
    int fExpand = 0;
    word uCube, uTruth = 0;
    Vec_Int_t * vTempLits = Vec_IntAlloc( 100 );
    int status, i, iVar, iLit, nFinal, * pFinal, pLits[2];
    assert( FreeVar < sat_solver_nvars(pSat) );
//    if ( fCompl )
//        pLits[0] = Abc_Var2Lit( sat_solver_nvars(pSat)-2, 0 ); // F = 1
//    else
        pLits[0] = Abc_Var2Lit( PivotVar, fCompl ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
        assert( status == l_True );
        if ( fExpand )
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[0]) ); // F = 0
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check during function comptutation.\n" );
            assert( status == l_False );
            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
                if ( pFinal[i] != pLits[0] )
                    Vec_IntPush( vTempLits, pFinal[i] );
        }
        else
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) );// NOT(iNewLit)
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, Abc_LitNot(sat_solver_var_literal(pSat, iVar)) );
        }
        uCube = ~(word)0;
        Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
        {
            iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(iLit) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        if ( status == 0 )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
    }
    Vec_IntFree( vTempLits );
    assert( 0 ); 
    return ~(word)0;
}